

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# escaping.cc
# Opt level: O0

bool absl::lts_20250127::CUnescape
               (string_view source,Nonnull<std::string_*> dest,Nullable<std::string_*> error)

{
  bool bVar1;
  Nullable<std::string_*> in_R9;
  string_view source_00;
  Nullable<std::string_*> error_local;
  Nonnull<std::string_*> dest_local;
  string_view source_local;
  
  source_00._M_len = source._M_str;
  source_00._M_str = (char *)0x0;
  bVar1 = anon_unknown_0::CUnescapeInternal
                    ((anon_unknown_0 *)source._M_len,source_00,SUB81(dest,0),error,in_R9);
  return bVar1;
}

Assistant:

bool CUnescape(absl::string_view source, absl::Nonnull<std::string*> dest,
               absl::Nullable<std::string*> error) {
  return CUnescapeInternal(source, kUnescapeNulls, dest, error);
}